

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::tls1_check_duplicate_extensions(CBS *cbs)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong new_size;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  Array<unsigned_short> extension_types;
  CBS extensions;
  uint16_t type;
  CBS local_68;
  CBS local_58;
  CBS local_40;
  
  local_58.data = cbs->data;
  local_58.len = cbs->len;
  new_size = 0;
  while (local_58.len != 0) {
    iVar3 = CBS_get_u16(&local_58,(uint16_t *)&local_40);
    if (iVar3 == 0) {
      bVar7 = false;
    }
    else {
      iVar3 = CBS_get_u16_length_prefixed(&local_58,&local_68);
      bVar7 = iVar3 != 0;
      new_size = new_size + bVar7;
    }
    if (!bVar7) {
      return false;
    }
  }
  if (new_size == 0) {
    return true;
  }
  local_68.data = (uint8_t *)0x0;
  local_68.len = 0;
  bVar7 = Array<unsigned_short>::InitUninitialized((Array<unsigned_short> *)&local_68,new_size);
  if (bVar7) {
    local_58.data = cbs->data;
    local_58.len = cbs->len;
    if (local_68.len != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        iVar3 = CBS_get_u16(&local_58,(uint16_t *)(local_68.data + lVar5));
        if ((iVar3 == 0) || (iVar3 = CBS_get_u16_length_prefixed(&local_58,&local_40), iVar3 == 0))
        goto LAB_0013822f;
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 2;
      } while (uVar6 < local_68.len);
    }
    puVar2 = local_68.data;
    if (local_58.len != 0) {
      __assert_fail("CBS_len(&extensions) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x58,"bool bssl::tls1_check_duplicate_extensions(const CBS *)");
    }
    if (local_68.len != 0) {
      puVar1 = local_68.data + local_68.len * 2;
      lVar5 = 0x3f;
      if (local_68.len != 0) {
        for (; local_68.len >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::__introsort_loop<unsigned_short*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_68.data,puVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>(puVar2,puVar1);
    }
    bVar7 = new_size == 1;
    if (!bVar7) {
      uVar6 = 2;
      if (2 < new_size) {
        uVar6 = new_size;
      }
      uVar4 = 2;
      do {
        if ((uVar4 - local_68.len == 2) ||
           (((1 - local_68.len) - (ulong)(local_68.len == 0)) + uVar4 == 2)) {
          abort();
        }
        if (*(short *)(local_68.data + (uVar4 - 2) * 2) ==
            *(short *)(local_68.data + (uVar4 - 1) * 2)) break;
        bVar7 = new_size <= uVar4;
        bVar8 = uVar4 != uVar6;
        uVar4 = uVar4 + 1;
      } while (bVar8);
    }
  }
  else {
LAB_0013822f:
    bVar7 = false;
  }
  OPENSSL_free(local_68.data);
  return bVar7;
}

Assistant:

static bool tls1_check_duplicate_extensions(const CBS *cbs) {
  // First pass: count the extensions.
  size_t num_extensions = 0;
  CBS extensions = *cbs;
  while (CBS_len(&extensions) > 0) {
    uint16_t type;
    CBS extension;

    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      return false;
    }

    num_extensions++;
  }

  if (num_extensions == 0) {
    return true;
  }

  Array<uint16_t> extension_types;
  if (!extension_types.InitForOverwrite(num_extensions)) {
    return false;
  }

  // Second pass: gather the extension types.
  extensions = *cbs;
  for (size_t i = 0; i < extension_types.size(); i++) {
    CBS extension;

    if (!CBS_get_u16(&extensions, &extension_types[i]) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      // This should not happen.
      return false;
    }
  }
  assert(CBS_len(&extensions) == 0);

  // Sort the extensions and make sure there are no duplicates.
  std::sort(extension_types.begin(), extension_types.end());
  for (size_t i = 1; i < num_extensions; i++) {
    if (extension_types[i - 1] == extension_types[i]) {
      return false;
    }
  }

  return true;
}